

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.h
# Opt level: O3

void CPartialMerkleTree::SerializationOps<DataStream,CPartialMerkleTree_const,ActionSerialize>
               (CPartialMerkleTree *obj,DataStream *s)

{
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  anon_class_8_1_a7b7af8b local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  SerializeMany<DataStream,unsigned_int,std::vector<uint256,std::allocator<uint256>>>
            (s,&obj->nTransactions,&obj->vHash);
  local_40.bytes = &local_38;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ActionSerialize::
  SerWrite<DataStream,CPartialMerkleTree_const&,CPartialMerkleTree::SerializationOps<DataStream,CPartialMerkleTree_const,ActionSerialize>(CPartialMerkleTree_const&,DataStream&,ActionSerialize)::_lambda(DataStream&,CPartialMerkleTree_const&)_1_>
            (s,obj,&local_40);
  SerializeMany<DataStream,std::vector<unsigned_char,std::allocator<unsigned_char>>>(s,&local_38);
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CPartialMerkleTree, obj)
    {
        READWRITE(obj.nTransactions, obj.vHash);
        std::vector<unsigned char> bytes;
        SER_WRITE(obj, bytes = BitsToBytes(obj.vBits));
        READWRITE(bytes);
        SER_READ(obj, obj.vBits = BytesToBits(bytes));
        SER_READ(obj, obj.fBad = false);
    }